

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_console.c
# Opt level: O3

void golf_debug_console_update(float dt)

{
  code *pcVar1;
  bool bVar2;
  ImGuiIO *pIVar3;
  long lVar4;
  long lVar5;
  
  if (inputs->button_clicked[0x60] == true) {
    golf_debug_console_update::debug_console_open = !golf_debug_console_update::debug_console_open;
  }
  if ((golf_debug_console_update::debug_console_open & 1U) != 0) {
    igSetNextWindowSize((ImVec2)0x43fa000043fa0000,4);
    igSetNextWindowPos((ImVec2)0x40a0000040a00000,4,(ImVec2)0x0);
    bVar2 = igBegin("Debug Console",&golf_debug_console_update::debug_console_open,0);
    if (bVar2) {
      bVar2 = igBeginTabBar("##Tabs",0);
      if (bVar2) {
        bVar2 = igBeginTabItem("Main",(bool *)0x0,0);
        if (bVar2) {
          pIVar3 = igGetIO();
          igText("Frame Rate: %0.3f\n",(double)pIVar3->Framerate);
          igText("Mouse Pos: <%0.3f, %0.3f>\n",(double)(inputs->mouse_pos).x,
                 (double)(inputs->mouse_pos).y);
          igEndTabItem();
        }
        bVar2 = igBeginTabItem("Data",(bool *)0x0,0);
        if (bVar2) {
          golf_data_debug_console_tab();
          igEndTabItem();
        }
        bVar2 = igBeginTabItem("Graphics",(bool *)0x0,0);
        if (bVar2) {
          golf_graphics_debug_console_tab();
          igEndTabItem();
        }
        if (0 < debug_console.tabs.length) {
          lVar4 = 8;
          lVar5 = 0;
          do {
            pcVar1 = *(code **)((long)&(debug_console.tabs.data)->name + lVar4);
            bVar2 = igBeginTabItem(*(char **)((long)debug_console.tabs.data + lVar4 + -8),
                                   (bool *)0x0,0);
            if (bVar2) {
              (*pcVar1)();
              igEndTabItem();
            }
            lVar5 = lVar5 + 1;
            lVar4 = lVar4 + 0x10;
          } while (lVar5 < debug_console.tabs.length);
        }
        igEndTabBar();
      }
      igEnd();
      return;
    }
  }
  return;
}

Assistant:

void golf_debug_console_update(float dt) {
    GOLF_UNUSED(dt);

    static bool debug_console_open = false;
    if (inputs->button_clicked[SAPP_KEYCODE_GRAVE_ACCENT]) {
        debug_console_open = !debug_console_open;
    }

    if (debug_console_open) {
        igSetNextWindowSize((ImVec2){500, 500}, ImGuiCond_FirstUseEver);
        igSetNextWindowPos((ImVec2){5, 5}, ImGuiCond_FirstUseEver, (ImVec2){0, 0});
        if (igBegin("Debug Console", &debug_console_open, ImGuiWindowFlags_None)) {
            if (igBeginTabBar("##Tabs", ImGuiTabBarFlags_None)) {
                if (igBeginTabItem("Main", NULL, ImGuiTabItemFlags_None)) {
                    _debug_console_main_tab();
                    igEndTabItem();
                }
                if (igBeginTabItem("Data", NULL, ImGuiTabItemFlags_None)) {
                    golf_data_debug_console_tab();
                    igEndTabItem();
                }
                if (igBeginTabItem("Graphics", NULL, ImGuiTabItemFlags_None)) {
                    golf_graphics_debug_console_tab();
                    igEndTabItem();
                }
                for (int i = 0; i < debug_console.tabs.length; i++) {
                    golf_debug_console_tab_t tab = debug_console.tabs.data[i];
                    if (igBeginTabItem(tab.name, NULL, ImGuiTabItemFlags_None)) {
                        tab.fn();
                        igEndTabItem();
                    }
                }
                igEndTabBar();
            }
            igEnd();
        }
    }
}